

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnionFind.h
# Opt level: O2

int __thiscall covenant::UnionFind::set(UnionFind *this,int src,int dest)

{
  int iVar1;
  int iVar2;
  
  iVar1 = lookup(this,dest);
  iVar2 = lookup(this,src);
  (this->mapping).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar2] = iVar1;
  return iVar1;
}

Assistant:

int set(int src, int dest){
      int edest = lookup(dest);
      int esrc = lookup(src);
      mapping[esrc] = edest;
      return edest;
    }